

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * String::fromPrintf(String *__return_storage_ptr__,char *format,...)

{
  usize *puVar1;
  code *pcVar2;
  char in_AL;
  uint uVar3;
  int iVar4;
  int iVar5;
  Data *pDVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  String s;
  va_list ap;
  String local_130;
  undefined8 local_108;
  String *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pDVar6 = (Data *)operator_new__(0xe9);
  pDVar6->str = (char *)(pDVar6 + 1);
  *(undefined1 *)&pDVar6[1].str = 0;
  pDVar6->len = 0;
  pDVar6->ref = 1;
  pDVar6->capacity = 200;
  local_108 = 0x3000000010;
  local_130.data = pDVar6;
  local_100 = &s;
  local_f8 = local_e8;
  uVar3 = vsnprintf(pDVar6->str,pDVar6->capacity,format,&local_108);
  if (((int)uVar3 < 0) || (pDVar6->capacity <= (ulong)uVar3)) {
    local_108 = 0x3000000010;
    local_100 = &s;
    local_f8 = local_e8;
    uVar3 = vsnprintf((char *)0x0,0,format,&local_108);
    if ((int)uVar3 < 0) {
      iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                            ,0x55,"result >= 0");
      if (iVar4 != 0) {
LAB_0010767b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      __return_storage_ptr__->data = &emptyData.super_Data;
      goto LAB_00107644;
    }
    detach(&local_130,0,(ulong)uVar3);
    local_108 = 0x3000000010;
    local_100 = &s;
    local_f8 = local_e8;
    iVar4 = vsnprintf((local_130.data)->str,(ulong)(uVar3 + 1),format,&local_108);
    if (iVar4 < 0) {
      iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/String.cpp"
                            ,0x5c,"result >= 0");
      if (iVar5 != 0) goto LAB_0010767b;
    }
    (local_130.data)->len = (long)iVar4;
  }
  else {
    pDVar6->len = (ulong)uVar3;
  }
  String(__return_storage_ptr__,&local_130);
LAB_00107644:
  if ((local_130.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_130.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_130.data != (Data *)0x0)) {
      operator_delete__(local_130.data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String String::fromPrintf(const char* format, ...)
{
  String s(200);

  int result;
  va_list ap;
  va_start(ap, format);

  {
    result = vsnprintf((char*)s.data->str, s.data->capacity, format, ap);
    va_end(ap);
    if(result >= 0 && (usize)result < s.data->capacity)
    {
      s.data->len = result;
      return s;
    }
  }

  // buffer was too small: compute size, reserve buffer, print again
  {
    va_start(ap, format);
#ifdef _MSC_VER
    result = _vscprintf(format, ap);
#else
    result = vsnprintf(0, 0, format, ap);
#endif
    va_end(ap);
    ASSERT(result >= 0);
    if(result < 0)
      return String();
    s.detach(0, result);
    va_start(ap, format);
    result = vsnprintf((char*)s.data->str, result + 1, format, ap);
    va_end(ap);
    ASSERT(result >= 0);
    s.data->len = result;
    va_end(ap);
    return s;
  }
}